

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackExternalGenerator.cxx
# Opt level: O3

int __thiscall cmCPackExternalGenerator::PackageFiles(cmCPackExternalGenerator *this)

{
  pointer pcVar1;
  cmCPackExternalVersionGenerator *pcVar2;
  cmCPackLog *this_00;
  long *msg;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  Value *this_01;
  StreamWriter *pSVar7;
  cmValue cVar8;
  size_t length;
  int iVar9;
  string_view arg;
  string filename;
  Value root;
  StreamWriterBuilder builder;
  ostringstream cmCPackLog_msg;
  ofstream fout;
  long *local_440 [2];
  long local_430 [2];
  long *local_420;
  long local_410 [2];
  Value local_400;
  StreamWriterBuilder local_3d8;
  undefined1 local_3a8 [112];
  ios_base local_338 [264];
  ValueHolder local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  Json::StreamWriterBuilder::StreamWriterBuilder(&local_3d8);
  Json::Value::Value((Value *)&local_230,"  ");
  pcVar1 = local_3a8 + 0x10;
  local_3a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"indentation","");
  this_01 = Json::StreamWriterBuilder::operator[](&local_3d8,(String *)local_3a8);
  Json::Value::operator=(this_01,(Value *)&local_230);
  if ((pointer)local_3a8._0_8_ != pcVar1) {
    operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
  }
  Json::Value::~Value((Value *)&local_230);
  local_440[0] = local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"package.json","");
  if ((this->super_cmCPackGenerator).packageFileNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->super_cmCPackGenerator).packageFileNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::_M_assign((string *)local_440);
  }
  std::ofstream::ofstream(&local_230,(char *)local_440[0],_S_out);
  pSVar7 = Json::StreamWriterBuilder::newStreamWriter(&local_3d8);
  Json::Value::Value(&local_400,objectValue);
  pcVar2 = (this->Generator)._M_t.
           super___uniq_ptr_impl<cmCPackExternalGenerator::cmCPackExternalVersionGenerator,_std::default_delete<cmCPackExternalGenerator::cmCPackExternalVersionGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmCPackExternalGenerator::cmCPackExternalVersionGenerator_*,_std::default_delete<cmCPackExternalGenerator::cmCPackExternalVersionGenerator>_>
           .
           super__Head_base<0UL,_cmCPackExternalGenerator::cmCPackExternalVersionGenerator_*,_false>
           ._M_head_impl;
  iVar5 = (*pcVar2->_vptr_cmCPackExternalVersionGenerator[2])(pcVar2,&local_400);
  if (iVar5 == 0) {
    Json::Value::~Value(&local_400);
    iVar5 = 0;
    if (pSVar7 == (StreamWriter *)0x0) goto LAB_001a5582;
  }
  else {
    iVar6 = (*pSVar7->_vptr_StreamWriter[2])(pSVar7,&local_400,&local_230);
    iVar9 = 0;
    iVar5 = 0;
    if (iVar6 == 0) {
      local_3a8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3a8,"CPACK_EXTERNAL_PACKAGE_SCRIPT","");
      cVar8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_3a8);
      if ((pointer)local_3a8._0_8_ != pcVar1) {
        operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
      }
      if ((cVar8.Value == (string *)0x0) || ((cVar8.Value)->_M_string_length == 0)) {
LAB_001a548a:
        iVar5 = 1;
      }
      else {
        bVar3 = cmsys::SystemTools::FileIsFullPath(cVar8.Value);
        iVar5 = iVar9;
        if (bVar3) {
          bVar3 = cmMakefile::ReadListFile((this->super_cmCPackGenerator).MakefileMap,cVar8.Value);
          if (((cmSystemTools::s_ErrorOccurred == false) &&
              (cmSystemTools::s_FatalErrorOccurred == false)) &&
             (bVar4 = cmSystemTools::GetInterruptFlag(), !bVar4 && bVar3)) {
            local_3a8._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3a8,"CPACK_EXTERNAL_BUILT_PACKAGES","");
            cVar8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_3a8);
            if ((pointer)local_3a8._0_8_ != pcVar1) {
              operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
            }
            if (cVar8.Value == (string *)0x0) goto LAB_001a548a;
            arg._M_str = ((cVar8.Value)->_M_dataplus)._M_p;
            arg._M_len = (cVar8.Value)->_M_string_length;
            cmExpandList(arg,&(this->super_cmCPackGenerator).packageFileNames,false);
            iVar5 = 1;
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3a8,
                     "CPACK_EXTERNAL_PACKAGE_SCRIPT does not contain a full file path",0x3f);
          std::ios::widen((char)(ostream *)local_3a8 +
                          (char)*(undefined8 *)(local_3a8._0_8_ + -0x18));
          std::ostream::put((char)local_3a8);
          std::ostream::flush();
          this_00 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          msg = local_420;
          length = strlen((char *)local_420);
          cmCPackLog::Log(this_00,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackExternalGenerator.cxx"
                          ,0x46,(char *)msg,length);
          if (local_420 != local_410) {
            operator_delete(local_420,local_410[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
          std::ios_base::~ios_base(local_338);
        }
      }
    }
    Json::Value::~Value(&local_400);
  }
  (*pSVar7->_vptr_StreamWriter[1])(pSVar7);
LAB_001a5582:
  local_230.int_ = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _EVP_PKEY_get_bn_param;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if (local_440[0] != local_430) {
    operator_delete(local_440[0],local_430[0] + 1);
  }
  Json::StreamWriterBuilder::~StreamWriterBuilder(&local_3d8);
  return iVar5;
}

Assistant:

int cmCPackExternalGenerator::PackageFiles()
{
  Json::StreamWriterBuilder builder;
  builder["indentation"] = "  ";

  std::string filename = "package.json";
  if (!this->packageFileNames.empty()) {
    filename = this->packageFileNames[0];
  }

  cmsys::ofstream fout(filename.c_str());
  std::unique_ptr<Json::StreamWriter> jout(builder.newStreamWriter());

  Json::Value root(Json::objectValue);

  if (!this->Generator->WriteToJSON(root)) {
    return 0;
  }

  if (jout->write(root, &fout)) {
    return 0;
  }

  cmValue packageScript = this->GetOption("CPACK_EXTERNAL_PACKAGE_SCRIPT");
  if (cmNonempty(packageScript)) {
    if (!cmSystemTools::FileIsFullPath(packageScript)) {
      cmCPackLogger(
        cmCPackLog::LOG_ERROR,
        "CPACK_EXTERNAL_PACKAGE_SCRIPT does not contain a full file path"
          << std::endl);
      return 0;
    }

    bool res = this->MakefileMap->ReadListFile(packageScript);

    if (cmSystemTools::GetErrorOccurredFlag() || !res) {
      return 0;
    }

    cmValue builtPackages = this->GetOption("CPACK_EXTERNAL_BUILT_PACKAGES");
    if (builtPackages) {
      cmExpandList(builtPackages, this->packageFileNames, false);
    }
  }

  return 1;
}